

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qhttpnetworkreply_p.cpp
# Opt level: O0

void QHttpNetworkReply::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  QMetaType QVar2;
  QtMocHelpers *in_RCX;
  undefined4 in_EDX;
  int in_ESI;
  QHttpNetworkReply *in_RDI;
  long in_FS_OFFSET;
  QHttpNetworkReply *_t;
  QHttpNetworkReply *in_stack_fffffffffffffe48;
  QHttpNetworkReply *in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe58;
  NetworkError in_stack_fffffffffffffe5c;
  NetworkError _t1;
  QMetaType local_80;
  QMetaTypeInterface *local_78;
  QMetaType local_70;
  QMetaTypeInterface *local_68;
  QMetaType local_60;
  QMetaTypeInterface *local_58;
  QMetaType local_50;
  QMetaTypeInterface *local_48;
  QMetaType local_40;
  QMetaTypeInterface *local_38;
  QMetaType local_30;
  QMetaType local_28 [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    switch(in_EDX) {
    case 0:
      encrypted((QHttpNetworkReply *)0x306d61);
      break;
    case 1:
      sslErrors(in_stack_fffffffffffffe50,(QList<QSslError> *)in_stack_fffffffffffffe48);
      break;
    case 2:
      preSharedKeyAuthenticationRequired
                ((QHttpNetworkReply *)0x306da0,
                 (QSslPreSharedKeyAuthenticator *)in_stack_fffffffffffffe48);
      break;
    case 3:
      socketStartedConnecting((QHttpNetworkReply *)0x306db2);
      break;
    case 4:
      requestSent((QHttpNetworkReply *)0x306dc4);
      break;
    case 5:
      readyRead((QHttpNetworkReply *)0x306dd6);
      break;
    case 6:
      finished((QHttpNetworkReply *)0x306de8);
      break;
    case 7:
      finishedWithError(in_stack_fffffffffffffe50,in_stack_fffffffffffffe5c,
                        (QString *)in_stack_fffffffffffffe48);
      break;
    case 8:
      _t1 = **(NetworkError **)(in_RCX + 8);
      QString::QString((QString *)0x306e45);
      finishedWithError(in_RDI,_t1,(QString *)in_stack_fffffffffffffe48);
      QString::~QString((QString *)0x306e68);
      break;
    case 9:
      headerChanged((QHttpNetworkReply *)0x306e7a);
      break;
    case 10:
      dataReadProgress(in_stack_fffffffffffffe48,
                       CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                       (qint64)in_stack_fffffffffffffe50);
      break;
    case 0xb:
      dataSendProgress(in_stack_fffffffffffffe48,
                       CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                       (qint64)in_stack_fffffffffffffe50);
      break;
    case 0xc:
      cacheCredentials(in_stack_fffffffffffffe50,(QHttpNetworkRequest *)in_stack_fffffffffffffe48,
                       (QAuthenticator *)
                       CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      break;
    case 0xd:
      proxyAuthenticationRequired
                (in_stack_fffffffffffffe50,(QNetworkProxy *)in_stack_fffffffffffffe48,
                 (QAuthenticator *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      break;
    case 0xe:
      authenticationRequired
                (in_stack_fffffffffffffe50,(QHttpNetworkRequest *)in_stack_fffffffffffffe48,
                 (QAuthenticator *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      break;
    case 0xf:
      redirected(in_stack_fffffffffffffe50,(QUrl *)in_stack_fffffffffffffe48,
                 in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58);
    }
  }
  if (in_ESI == 7) {
    switch(in_EDX) {
    case 1:
      if (**(int **)(in_RCX + 8) == 0) {
        local_38 = (QMetaTypeInterface *)QMetaType::fromType<QList<QSslError>>();
        **(undefined8 **)in_RCX = local_38;
      }
      else {
        memset(&local_30,0,8);
        QMetaType::QMetaType(&local_30);
        **(undefined8 **)in_RCX = local_30.d_ptr;
      }
      break;
    case 2:
      if (**(int **)(in_RCX + 8) == 0) {
        local_48 = (QMetaTypeInterface *)QMetaType::fromType<QSslPreSharedKeyAuthenticator*>();
        **(undefined8 **)in_RCX = local_48;
      }
      else {
        memset(&local_40,0,8);
        QMetaType::QMetaType(&local_40);
        **(undefined8 **)in_RCX = local_40.d_ptr;
      }
      break;
    default:
      memset(local_28,0,8);
      QMetaType::QMetaType(local_28);
      **(undefined8 **)in_RCX = local_28[0].d_ptr;
      break;
    case 7:
      if (**(int **)(in_RCX + 8) == 0) {
        local_58 = (QMetaTypeInterface *)QMetaType::fromType<QNetworkReply::NetworkError>();
        **(undefined8 **)in_RCX = local_58;
      }
      else {
        memset(&local_50,0,8);
        QMetaType::QMetaType(&local_50);
        **(undefined8 **)in_RCX = local_50.d_ptr;
      }
      break;
    case 8:
      if (**(int **)(in_RCX + 8) == 0) {
        local_68 = (QMetaTypeInterface *)QMetaType::fromType<QNetworkReply::NetworkError>();
        **(undefined8 **)in_RCX = local_68;
      }
      else {
        memset(&local_60,0,8);
        QMetaType::QMetaType(&local_60);
        **(undefined8 **)in_RCX = local_60.d_ptr;
      }
      break;
    case 0xc:
      if (**(int **)(in_RCX + 8) == 0) {
        local_78 = (QMetaTypeInterface *)QMetaType::fromType<QHttpNetworkRequest>();
        **(undefined8 **)in_RCX = local_78;
      }
      else {
        memset(&local_70,0,8);
        QMetaType::QMetaType(&local_70);
        **(undefined8 **)in_RCX = local_70.d_ptr;
      }
      break;
    case 0xe:
      if (**(int **)(in_RCX + 8) == 0) {
        QVar2 = QMetaType::fromType<QHttpNetworkRequest>();
        **(undefined8 **)in_RCX = QVar2.d_ptr;
      }
      else {
        memset(&local_80,0,8);
        QMetaType::QMetaType(&local_80);
        **(undefined8 **)in_RCX = local_80.d_ptr;
      }
    }
  }
  if (((((in_ESI == 5) &&
        (bVar1 = QtMocHelpers::indexOfMethod<void(QHttpNetworkReply::*)()>
                           (in_RCX,(void **)encrypted,0,0), !bVar1)) &&
       (bVar1 = QtMocHelpers::indexOfMethod<void(QHttpNetworkReply::*)(QList<QSslError>const&)>
                          (in_RCX,(void **)sslErrors,0,1), !bVar1)) &&
      (((bVar1 = QtMocHelpers::
                 indexOfMethod<void(QHttpNetworkReply::*)(QSslPreSharedKeyAuthenticator*)>
                           (in_RCX,(void **)preSharedKeyAuthenticationRequired,0,2), !bVar1 &&
        (bVar1 = QtMocHelpers::indexOfMethod<void(QHttpNetworkReply::*)()>
                           (in_RCX,(void **)socketStartedConnecting,0,3), !bVar1)) &&
       ((bVar1 = QtMocHelpers::indexOfMethod<void(QHttpNetworkReply::*)()>
                           (in_RCX,(void **)requestSent,0,4), !bVar1 &&
        ((bVar1 = QtMocHelpers::indexOfMethod<void(QHttpNetworkReply::*)()>
                            (in_RCX,(void **)readyRead,0,5), !bVar1 &&
         (bVar1 = QtMocHelpers::indexOfMethod<void(QHttpNetworkReply::*)()>
                            (in_RCX,(void **)finished,0,6), !bVar1)))))))) &&
     ((bVar1 = QtMocHelpers::
               indexOfMethod<void(QHttpNetworkReply::*)(QNetworkReply::NetworkError,QString_const&)>
                         (in_RCX,(void **)finishedWithError,0,7), !bVar1 &&
      (((((bVar1 = QtMocHelpers::indexOfMethod<void(QHttpNetworkReply::*)()>
                             (in_RCX,(void **)headerChanged,0,9), !bVar1 &&
          (bVar1 = QtMocHelpers::indexOfMethod<void(QHttpNetworkReply::*)(long_long,long_long)>
                             (in_RCX,(void **)dataReadProgress,0,10), !bVar1)) &&
         (bVar1 = QtMocHelpers::indexOfMethod<void(QHttpNetworkReply::*)(long_long,long_long)>
                            (in_RCX,(void **)dataSendProgress,0,0xb), !bVar1)) &&
        ((bVar1 = QtMocHelpers::
                  indexOfMethod<void(QHttpNetworkReply::*)(QHttpNetworkRequest_const&,QAuthenticator*)>
                            (in_RCX,(void **)cacheCredentials,0,0xc), !bVar1 &&
         (bVar1 = QtMocHelpers::
                  indexOfMethod<void(QHttpNetworkReply::*)(QNetworkProxy_const&,QAuthenticator*)>
                            (in_RCX,(void **)proxyAuthenticationRequired,0,0xd), !bVar1)))) &&
       (bVar1 = QtMocHelpers::
                indexOfMethod<void(QHttpNetworkReply::*)(QHttpNetworkRequest_const&,QAuthenticator*)>
                          (in_RCX,(void **)authenticationRequired,0,0xe), !bVar1)))))) {
    QtMocHelpers::indexOfMethod<void(QHttpNetworkReply::*)(QUrl_const&,int,int)>
              (in_RCX,(void **)redirected,0,0xf);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpNetworkReply::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QHttpNetworkReply *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->encrypted(); break;
        case 1: _t->sslErrors((*reinterpret_cast< std::add_pointer_t<QList<QSslError>>>(_a[1]))); break;
        case 2: _t->preSharedKeyAuthenticationRequired((*reinterpret_cast< std::add_pointer_t<QSslPreSharedKeyAuthenticator*>>(_a[1]))); break;
        case 3: _t->socketStartedConnecting(); break;
        case 4: _t->requestSent(); break;
        case 5: _t->readyRead(); break;
        case 6: _t->finished(); break;
        case 7: _t->finishedWithError((*reinterpret_cast< std::add_pointer_t<QNetworkReply::NetworkError>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 8: _t->finishedWithError((*reinterpret_cast< std::add_pointer_t<QNetworkReply::NetworkError>>(_a[1]))); break;
        case 9: _t->headerChanged(); break;
        case 10: _t->dataReadProgress((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[2]))); break;
        case 11: _t->dataSendProgress((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[2]))); break;
        case 12: _t->cacheCredentials((*reinterpret_cast< std::add_pointer_t<QHttpNetworkRequest>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAuthenticator*>>(_a[2]))); break;
        case 13: _t->proxyAuthenticationRequired((*reinterpret_cast< std::add_pointer_t<QNetworkProxy>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAuthenticator*>>(_a[2]))); break;
        case 14: _t->authenticationRequired((*reinterpret_cast< std::add_pointer_t<QHttpNetworkRequest>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAuthenticator*>>(_a[2]))); break;
        case 15: _t->redirected((*reinterpret_cast< std::add_pointer_t<QUrl>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 1:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<QSslError> >(); break;
            }
            break;
        case 2:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslPreSharedKeyAuthenticator* >(); break;
            }
            break;
        case 7:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkReply::NetworkError >(); break;
            }
            break;
        case 8:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkReply::NetworkError >(); break;
            }
            break;
        case 12:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QHttpNetworkRequest >(); break;
            }
            break;
        case 14:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QHttpNetworkRequest >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)()>(_a, &QHttpNetworkReply::encrypted, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)(const QList<QSslError> & )>(_a, &QHttpNetworkReply::sslErrors, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)(QSslPreSharedKeyAuthenticator * )>(_a, &QHttpNetworkReply::preSharedKeyAuthenticationRequired, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)()>(_a, &QHttpNetworkReply::socketStartedConnecting, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)()>(_a, &QHttpNetworkReply::requestSent, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)()>(_a, &QHttpNetworkReply::readyRead, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)()>(_a, &QHttpNetworkReply::finished, 6))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)(QNetworkReply::NetworkError , const QString & )>(_a, &QHttpNetworkReply::finishedWithError, 7))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)()>(_a, &QHttpNetworkReply::headerChanged, 9))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)(qint64 , qint64 )>(_a, &QHttpNetworkReply::dataReadProgress, 10))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)(qint64 , qint64 )>(_a, &QHttpNetworkReply::dataSendProgress, 11))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)(const QHttpNetworkRequest & , QAuthenticator * )>(_a, &QHttpNetworkReply::cacheCredentials, 12))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)(const QNetworkProxy & , QAuthenticator * )>(_a, &QHttpNetworkReply::proxyAuthenticationRequired, 13))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)(const QHttpNetworkRequest & , QAuthenticator * )>(_a, &QHttpNetworkReply::authenticationRequired, 14))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)(const QUrl & , int , int )>(_a, &QHttpNetworkReply::redirected, 15))
            return;
    }
}